

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O1

void __thiscall player_t::SetLogText(player_t *this,char *text)

{
  bool bVar1;
  
  FString::operator=(&this->LogText,text);
  bVar1 = AActor::CheckLocalView(&this->mo->super_AActor,consoleplayer);
  if (bVar1) {
    AddToConsole(-1,"\x1cF");
    AddToConsole(-1,(this->LogText).Chars);
    AddToConsole(-1,"\n");
    return;
  }
  return;
}

Assistant:

void player_t::SetLogText (const char *text)
{
	LogText = text;

	if (mo->CheckLocalView(consoleplayer))
	{
		// Print log text to console
		AddToConsole(-1, TEXTCOLOR_GOLD);
		AddToConsole(-1, LogText);
		AddToConsole(-1, "\n");
	}
}